

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetScanDataResponseFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistance,double *pAngle,BOOL *pbNewScan,int *pQuality)

{
  int iVar1;
  long lVar2;
  CRITICAL_SECTION *__mutex;
  
  __mutex = RPLIDARCS;
  lVar2 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar2 * 2) == pRPLIDAR) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      *pDistance = *(double *)((long)distanceRPLIDAR + lVar2 * 2);
      *pAngle = *(double *)((long)angleRPLIDAR + lVar2 * 2);
      *pbNewScan = *(BOOL *)((long)bNewScanRPLIDAR + lVar2);
      *pQuality = *(int *)((long)qualityRPLIDAR + lVar2);
      iVar1 = *(int *)((long)resRPLIDAR + lVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    __mutex = __mutex + 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int GetScanDataResponseFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistance, double* pAngle, BOOL* pbNewScan, int *pQuality)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&RPLIDARCS[id]);
	*pDistance = distanceRPLIDAR[id];
	*pAngle = angleRPLIDAR[id];
	*pbNewScan = bNewScanRPLIDAR[id];
	*pQuality = qualityRPLIDAR[id];
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	return res;
}